

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O0

void __thiscall
cppcms::widgets::select_multiple::element::element(element *this,string *val,message *msg,bool sel)

{
  byte bVar1;
  byte in_CL;
  string *in_RSI;
  uint *in_RDI;
  basic_message<char> *in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffe0;
  
  bVar1 = in_CL & 1;
  *in_RDI = *in_RDI & 0xfffffffe | (uint)bVar1;
  *(byte *)in_RDI = (byte)*in_RDI | 2;
  *in_RDI = (*in_RDI & 0xfffffffb) + (uint)bVar1 * 4;
  std::__cxx11::string::string((string *)(in_RDI + 2),in_RSI);
  std::__cxx11::string::string((string *)(in_RDI + 10));
  booster::locale::basic_message<char>::basic_message
            ((basic_message<char> *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),
             in_stack_ffffffffffffffd8);
  return;
}

Assistant:

select_multiple::element::element(std::string const &val,locale::message const &msg,bool sel) :
	selected(sel),
	need_translation(1),
	original_select(sel),
	id(val),
	tr_option(msg)
{
}